

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::TruncateStdoutStderr(void)

{
  uint64 limit;
  
  limit = 0x100000;
  if (fLU::FLAGS_max_log_size - 1U < 0xfff) {
    limit = (uint64)(uint)(fLU::FLAGS_max_log_size << 0x14);
  }
  TruncateLogFile("/proc/self/fd/1",limit,0x100000);
  TruncateLogFile("/proc/self/fd/2",limit,0x100000);
  return;
}

Assistant:

static uint32 MaxLogSize() {
  return (FLAGS_max_log_size > 0 && FLAGS_max_log_size < 4096
              ? FLAGS_max_log_size
              : 1);
}